

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

void ncnn_convert_packing(ncnn_mat_t src,ncnn_mat_t *dst,int elempack,ncnn_option_t opt)

{
  int *piVar1;
  ncnn_mat_t p_Var2;
  Mat local_58;
  
  local_58.cstep = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.elemsize._0_4_ = 0;
  local_58.elemsize._4_4_ = 0;
  local_58.elempack = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.d = 0;
  local_58.c = 0;
  ncnn::convert_packing((Mat *)src,&local_58,elempack,(Option *)opt);
  p_Var2 = (ncnn_mat_t)operator_new(0x48);
  *(void **)p_Var2 = local_58.data;
  piVar1 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  *(int **)(p_Var2 + 8) = piVar1;
  *(ulong *)(p_Var2 + 0x10) = CONCAT44(local_58.elemsize._4_4_,(undefined4)local_58.elemsize);
  *(int *)(p_Var2 + 0x18) = local_58.elempack;
  *(Allocator **)(p_Var2 + 0x20) = local_58.allocator;
  *(int *)(p_Var2 + 0x28) = local_58.dims;
  *(int *)(p_Var2 + 0x2c) = local_58.w;
  *(int *)(p_Var2 + 0x30) = local_58.h;
  *(int *)(p_Var2 + 0x34) = local_58.d;
  *(int *)(p_Var2 + 0x38) = local_58.c;
  *(size_t *)(p_Var2 + 0x40) = local_58.cstep;
  if (piVar1 == (int *)0x0) {
    *dst = p_Var2;
  }
  else {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    piVar1 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
    *dst = p_Var2;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_58.allocator == (Allocator *)0x0) {
          if (local_58.data != (void *)0x0) {
            free(local_58.data);
          }
        }
        else {
          (*(local_58.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return;
}

Assistant:

void ncnn_convert_packing(const ncnn_mat_t src, ncnn_mat_t* dst, int elempack, const ncnn_option_t opt)
{
    Mat _dst;
    ncnn::convert_packing(*(const Mat*)src, _dst, elempack, *(Option*)opt);
    *dst = (ncnn_mat_t)(new Mat(_dst));
}